

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
          (Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *this)

{
  ExtendInfo *pEVar1;
  size_t sVar2;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (ExtendInfo *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ExtendInfo *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x48,sVar2,sVar2,
               ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::
               destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }